

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::~IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x807a68;
  *(undefined8 *)&this->field_0x180 = 0x807b80;
  *(undefined8 *)&this->field_0x88 = 0x807a90;
  *(undefined8 *)&this->field_0x98 = 0x807ab8;
  *(undefined8 *)&this->field_0xd0 = 0x807ae0;
  *(undefined8 *)&this->field_0x100 = 0x807b08;
  *(undefined8 *)&this->field_0x138 = 0x807b30;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x807b58;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).
             field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).
            field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__00807ba0);
  operator_delete(this,0x198);
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}